

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task32.cpp
# Opt level: O1

double do_oper(stack<double,_std::deque<double,_std::allocator<double>_>_> *temp,char oper)

{
  _Elt_pointer pdVar1;
  ostream *poVar2;
  double dVar3;
  char local_21;
  double local_20;
  double local_18;
  
  pdVar1 = (temp->c).super__Deque_base<double,_std::allocator<double>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pdVar1 == (temp->c).super__Deque_base<double,_std::allocator<double>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    pdVar1 = (temp->c).super__Deque_base<double,_std::allocator<double>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  local_18 = pdVar1[-1];
  std::deque<double,_std::allocator<double>_>::pop_back(&temp->c);
  pdVar1 = (temp->c).super__Deque_base<double,_std::allocator<double>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pdVar1 == (temp->c).super__Deque_base<double,_std::allocator<double>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    pdVar1 = (temp->c).super__Deque_base<double,_std::allocator<double>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  local_20 = pdVar1[-1];
  std::deque<double,_std::allocator<double>_>::pop_back(&temp->c);
  switch((int)oper) {
  case 0x2a:
    local_20 = local_18 * local_20;
    break;
  case 0x2b:
    local_20 = local_18 + local_20;
    break;
  case 0x2d:
    local_20 = local_20 - local_18;
    break;
  case 0x2f:
    local_20 = local_20 / local_18;
    break;
  default:
    if (oper == 0x5e) {
      dVar3 = pow(local_20,local_18);
      return dVar3;
    }
  case 0x2c:
  case 0x2e:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"invalid operator ",0x11);
    local_21 = oper;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_21,1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    local_20 = 0.0;
  }
  return local_20;
}

Assistant:

double do_oper (stack<double>& temp, char oper) {
    double b = temp.top(); temp.pop();  // порядок считывания
    double a = temp.top(); temp.pop();
    switch (oper) {
        case '+':
            return a + b;
        case '-':
            return a - b;
        case '*':
            return a * b;
        case '/':
            return a / b;
        case '^':
            return pow(a,b);
        default:
            cout << "invalid operator " << oper << endl;
            return 0;
    }
}